

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

TypedValue * ToWabtValue(TypedValue *__return_storage_ptr__,wasm_val_t *value)

{
  FILE *__stream;
  uint uVar1;
  Object *this;
  undefined8 uVar2;
  TypedValue *extraout_RDX;
  TypedValue *extraout_RDX_00;
  TypedValue *extraout_RDX_01;
  TypedValue *extraout_RDX_02;
  TypedValue *extraout_RDX_03;
  TypedValue *tv;
  TypedValue *out;
  string local_40;
  Ref local_20;
  ValueType local_18;
  wasm_val_t *local_10;
  wasm_val_t *value_local;
  
  local_10 = value;
  wabt::interp::TypedValue::TypedValue(__return_storage_ptr__);
  local_18 = ToWabtValueType(local_10->kind);
  __return_storage_ptr__->type = local_18;
  uVar1 = (uint)local_10->kind;
  if (uVar1 == 0) {
    wabt::interp::Value::Set<int>(&__return_storage_ptr__->value,(local_10->of).i32);
    tv = extraout_RDX;
  }
  else if (uVar1 == 1) {
    wabt::interp::Value::Set<long>(&__return_storage_ptr__->value,(local_10->of).i64);
    tv = extraout_RDX_00;
  }
  else if (uVar1 == 2) {
    wabt::interp::Value::Set<float>(&__return_storage_ptr__->value,(local_10->of).f32);
    tv = extraout_RDX_01;
  }
  else if (uVar1 == 3) {
    wabt::interp::Value::Set<double>(&__return_storage_ptr__->value,(local_10->of).f64);
    tv = extraout_RDX_02;
  }
  else {
    if (1 < uVar1 - 0x80) {
      fprintf(_stderr,"CAPI: [%s] unexpected wasm type: %d\n","ToWabtValue",(ulong)local_10->kind);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                    ,0x1b1,"TypedValue ToWabtValue(const wasm_val_t &)");
    }
    if ((local_10->of).i64 == 0) {
      local_20.index = wabt::interp::Ref::Null;
    }
    else {
      this = wabt::interp::RefPtr<wabt::interp::Object>::operator->(&((local_10->of).ref)->I);
      local_20 = wabt::interp::Object::self(this);
    }
    wabt::interp::Value::Set<wabt::interp::Ref>(&__return_storage_ptr__->value,local_20);
    tv = extraout_RDX_03;
  }
  __stream = _stderr;
  wabt::interp::TypedValueToString_abi_cxx11_(&local_40,(interp *)__return_storage_ptr__,tv);
  uVar2 = std::__cxx11::string::c_str();
  fprintf(__stream,"CAPI: [%s] -> %s\n","ToWabtValue",uVar2);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static TypedValue ToWabtValue(const wasm_val_t& value) {
  TypedValue out;
  out.type = ToWabtValueType(value.kind);
  switch (value.kind) {
    case WASM_I32:
      out.value.Set(value.of.i32);
      break;
    case WASM_I64:
      out.value.Set(value.of.i64);
      break;
    case WASM_F32:
      out.value.Set(value.of.f32);
      break;
    case WASM_F64:
      out.value.Set(value.of.f64);
      break;
    case WASM_ANYREF:
    case WASM_FUNCREF:
      out.value.Set(value.of.ref ? value.of.ref->I->self() : Ref::Null);
      break;
    default:
      TRACE("unexpected wasm type: %d", value.kind);
      assert(false);
  }
  TRACE("-> %s", TypedValueToString(out).c_str());
  return out;
}